

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::next_turn(optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this)

{
  TurnHistory *this_00;
  CommandType CVar1;
  bool bVar2;
  bool bVar3;
  pointer pCVar4;
  vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> subturn_commands;
  TurnHistory cancelled_turn_history;
  TurnHistory last_turn_history_save;
  Level last_turn_save;
  vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> local_b0;
  TurnHistory local_98;
  TurnHistory local_78;
  Level local_58;
  
  Level::Level(&local_58,&this->m_current_level);
  this_00 = &this->m_turn_history;
  TurnHistory::TurnHistory(&local_78,this_00);
  local_98.subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.was_turn_cancelled = false;
  local_98._25_7_ = 0;
  local_98.subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  TurnHistory::operator=(this_00,&local_98);
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
            (&local_98.subturns);
  bVar2 = false;
  do {
    next_subturn(this);
    SubturnHistory::gather_all_subturn_commands
              (&local_b0,
               (this->m_turn_history).subturns.
               super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    bVar3 = false;
    for (pCVar4 = local_b0.
                  super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar4 != local_b0.
                  super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pCVar4 = pCVar4 + 1) {
      CVar1 = pCVar4->type;
      if (CVar1 == Win) {
        bVar2 = true;
        bVar3 = false;
      }
      else if (CVar1 == Again) {
        bVar3 = (bool)(bVar2 ^ 1U | bVar3);
      }
      else if (CVar1 == Cancel) {
        Level::operator=(&this->m_current_level,&local_58);
        TurnHistory::TurnHistory(&local_98,this_00);
        local_98.was_turn_cancelled = true;
        TurnHistory::operator=(this_00,&local_78);
        std::_Optional_payload_base<PSEngine::TurnHistory>::
        _Optional_payload_base<PSEngine::TurnHistory&>
                  ((_Optional_payload_base<PSEngine::TurnHistory> *)__return_storage_ptr__,&local_98
                  );
        std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
                  (&local_98.subturns);
        std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::~vector
                  (&local_b0);
        goto LAB_0010e835;
      }
    }
    std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::~vector(&local_b0);
    if (!bVar3) {
      if ((this->m_turn_history).subturns.
          super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this->m_turn_history).subturns.
          super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::push_back
                  (&this->m_level_state_stack,&local_58);
        print_subturns_history(this);
      }
      bVar3 = check_win_conditions(this);
      if ((bVar3) || (bVar2)) {
        this->m_is_level_won = true;
      }
      std::_Optional_payload_base<PSEngine::TurnHistory>::
      _Optional_payload_base<PSEngine::TurnHistory&>
                ((_Optional_payload_base<PSEngine::TurnHistory> *)__return_storage_ptr__,this_00);
LAB_0010e835:
      std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
                (&local_78.subturns);
      std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&local_58.cells);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::next_turn()
{
    Level last_turn_save = m_current_level;
    TurnHistory last_turn_history_save = m_turn_history;

    m_turn_history = TurnHistory();

    bool win_requested_by_command = false;
    bool keep_computing_subturn = false;
    do
    {
        keep_computing_subturn = false;

        if(next_subturn())
        {
            vector<CompiledGame::Command> subturn_commands = m_turn_history.subturns.back().gather_all_subturn_commands();

            for(const auto& command : subturn_commands)
            {
                if(command.type == CompiledGame::CommandType::Win)
                {
                    win_requested_by_command = true;
                    keep_computing_subturn = false;
                }
                else if (command.type == CompiledGame::CommandType::Cancel)
                {
                    m_current_level = last_turn_save;
                    TurnHistory cancelled_turn_history = m_turn_history;
                    cancelled_turn_history.was_turn_cancelled = true;
                    m_turn_history = last_turn_history_save;
                    return optional<PSEngine::TurnHistory>(cancelled_turn_history);
                }
                else if (command.type == CompiledGame::CommandType::Again)
                {
                    if(!win_requested_by_command)
                    {
                        keep_computing_subturn = true;
                    }
                }

            }
        }

    } while (keep_computing_subturn); //todo add an infinite loop safety

    if( m_turn_history.subturns.size() > 0)
    {
        m_level_state_stack.push_back(last_turn_save);
        print_subturns_history();
    }
    //else it means nothing happened

    if(check_win_conditions() || win_requested_by_command)
    {
        m_is_level_won = true;
    }

    return optional<PSEngine::TurnHistory>(m_turn_history);
}